

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# projectwriter.cpp
# Opt level: O3

void __thiscall ProjectWriter::writeTimes(ProjectWriter *this)

{
  string local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&this->field_0x18,"\n[TIMES]\n",9);
  Options::timeOptionsToStr_abi_cxx11_(&local_38,&this->network->options);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&this->field_0x18,local_38._M_dataplus._M_p,local_38._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return;
}

Assistant:

void ProjectWriter::writeTimes()
{
    fout << "\n[TIMES]\n";
    fout << network->options.timeOptionsToStr();
}